

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int exp1(LexState *ls,Fornuminfo *info)

{
  int iVar1;
  undefined4 uVar2;
  expdesc e;
  expdesc local_58;
  
  local_58.usertype = (TString *)0x0;
  local_58.k = VVOID;
  local_58._4_4_ = 0;
  local_58.u.ival = 0;
  local_58.u.ind.usertype = (TString *)0x0;
  local_58.t = 0;
  local_58.f = 0;
  local_58.ravi_type_map = 0xffffffff;
  local_58._36_4_ = 0;
  local_58.pc = -1;
  local_58._52_4_ = 0;
  iVar1 = (ls->t).token;
  subexpr(ls,&local_58,0);
  if (((byte)ravi_parser_debug & 1) != 0) {
    raviY_printf(ls->fs,"fornum exp -> %e\n",&local_58);
  }
  info->is_constant = (uint)(local_58.k == VKINT);
  uVar2 = 0;
  if (local_58.k == VKINT) {
    uVar2 = local_58.u.info;
  }
  info->int_value = uVar2;
  luaK_exp2nextreg(ls->fs,&local_58);
  if (local_58.k == VNONRELOC) {
    if (local_58.ravi_type_map != 8 && iVar1 == 0x23) {
      luaK_codeABC(ls->fs,OP_RAVI_TOINT,local_58.u.info,0,0);
      local_58.ravi_type_map = 8;
    }
    info->type_map = local_58.ravi_type_map;
    return local_58.ravi_type_map;
  }
  __assert_fail("e.k == VNONRELOC",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x80c,"int exp1(LexState *, Fornuminfo *)");
}

Assistant:

static int exp1 (LexState *ls, Fornuminfo *info) {
  /* Since the local variable in a fornum loop is local to the loop and does
   * not use any variable in outer scope we don't need to check its
   * type - also the loop is already optimised so no point trying to
   * optimise the iteration variable
   */
  expdesc e = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int reg;
  int expect_int = 0;
  if (ls->t.token == '#')
    expect_int = 1;
  expr(ls, &e);
  DEBUG_EXPR(raviY_printf(ls->fs, "fornum exp -> %e\n", &e));
  info->is_constant = (e.k == VKINT);
  info->int_value = info->is_constant ? e.u.ival : 0;
  luaK_exp2nextreg(ls->fs, &e);
  lua_assert(e.k == VNONRELOC);
  reg = e.u.info;
  if (expect_int && e.ravi_type_map != RAVI_TM_INTEGER) {
    luaK_codeABC(ls->fs, OP_RAVI_TOINT, reg, 0, 0);
    info->type_map = RAVI_TM_INTEGER;
  }
  else {
    info->type_map = e.ravi_type_map;
  }
  return reg;
}